

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_image_t * opj_jp2_decode(opj_jp2_t *jp2,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  opj_bool oVar1;
  opj_cio_t *in_RDX;
  opj_j2k_t *in_RSI;
  undefined8 *in_RDI;
  opj_jp2_color_t color;
  opj_image_t *image;
  opj_common_ptr cinfo;
  opj_jp2_color_t *in_stack_ffffffffffffffa8;
  OPJ_INT32 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  opj_jp2_t *in_stack_ffffffffffffffb8;
  long local_40;
  opj_codestream_info_t *cstr_info_00;
  opj_jp2_color_t *in_stack_fffffffffffffff8;
  opj_image_t *poVar2;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == (opj_j2k_t *)0x0)) {
    poVar2 = (opj_image_t *)0x0;
  }
  else {
    memset(&stack0xffffffffffffffa8,0,0x28);
    cstr_info_00 = (opj_codestream_info_t *)*in_RDI;
    oVar1 = jp2_read_struct(in_stack_ffffffffffffffb8,
                            (opj_cio_t *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
    if (oVar1 == 0) {
      free_color_data((opj_jp2_color_t *)0x2bc035);
      opj_event_msg((opj_common_ptr)cstr_info_00,1,"Failed to decode jp2 structure\n");
      poVar2 = (opj_image_t *)0x0;
    }
    else {
      poVar2 = j2k_decode(in_RSI,in_RDX,cstr_info_00);
      if (poVar2 == (opj_image_t *)0x0) {
        free_color_data((opj_jp2_color_t *)0x2bc088);
        opj_event_msg((opj_common_ptr)cstr_info_00,1,"Failed to decode J2K image\n");
        poVar2 = (opj_image_t *)0x0;
      }
      else if (*(int *)((long)in_RDI + 100) == 0) {
        if (*(int *)((long)in_RDI + 0x34) == 0x10) {
          poVar2->color_space = CLRSPC_SRGB;
        }
        else if (*(int *)((long)in_RDI + 0x34) == 0x11) {
          poVar2->color_space = CLRSPC_GRAY;
        }
        else if (*(int *)((long)in_RDI + 0x34) == 0x12) {
          poVar2->color_space = CLRSPC_SYCC;
        }
        else {
          poVar2->color_space = CLRSPC_UNKNOWN;
        }
        if (in_stack_ffffffffffffffb8 != (opj_jp2_t *)0x0) {
          jp2_apply_cdef((opj_image_t *)color.icc_profile_buf,in_stack_fffffffffffffff8);
        }
        if (local_40 != 0) {
          if (*(long *)(local_40 + 0x18) == 0) {
            jp2_free_pclr((opj_jp2_color_t *)0x2bc149);
          }
          else {
            jp2_apply_pclr((opj_image_t *)color.icc_profile_buf,in_stack_fffffffffffffff8);
          }
        }
        if (in_stack_ffffffffffffffa8 != (opj_jp2_color_t *)0x0) {
          poVar2->icc_profile_buf = (OPJ_BYTE *)in_stack_ffffffffffffffa8;
          poVar2->icc_profile_len = in_stack_ffffffffffffffb0;
        }
      }
    }
  }
  return poVar2;
}

Assistant:

opj_image_t* opj_jp2_decode(opj_jp2_t *jp2, opj_cio_t *cio, 
	opj_codestream_info_t *cstr_info) 
{
	opj_common_ptr cinfo;
	opj_image_t *image = NULL;
	opj_jp2_color_t color;

	if(!jp2 || !cio) 
   {
	return NULL;
   }
	memset(&color, 0, sizeof(opj_jp2_color_t));
	cinfo = jp2->cinfo;

/* JP2 decoding */
	if(!jp2_read_struct(jp2, cio, &color)) 
   {
	free_color_data(&color);
	opj_event_msg(cinfo, EVT_ERROR, "Failed to decode jp2 structure\n");
	return NULL;
   }

/* J2K decoding */
	image = j2k_decode(jp2->j2k, cio, cstr_info);

	if(!image) 
   {
	free_color_data(&color);
	opj_event_msg(cinfo, EVT_ERROR, "Failed to decode J2K image\n");
	return NULL;
   }
   
    if (!jp2->ignore_pclr_cmap_cdef){

    /* Set Image Color Space */
	if (jp2->enumcs == 16)
		image->color_space = CLRSPC_SRGB;
	else if (jp2->enumcs == 17)
		image->color_space = CLRSPC_GRAY;
	else if (jp2->enumcs == 18)
		image->color_space = CLRSPC_SYCC;
	else
		image->color_space = CLRSPC_UNKNOWN;

	if(color.jp2_cdef)
   {
	jp2_apply_cdef(image, &color);
   }
	if(color.jp2_pclr)
   {
/* Part 1, I.5.3.4: Either both or none : */
	if( !color.jp2_pclr->cmap) 
	 jp2_free_pclr(&color);
	else
	 jp2_apply_pclr(image, &color);
   }
	if(color.icc_profile_buf)
   {
	image->icc_profile_buf = color.icc_profile_buf;
	color.icc_profile_buf = NULL;
	image->icc_profile_len = color.icc_profile_len;
   }
   }
   
	return image;

}